

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

void createKeyTables(void)

{
  int iVar1;
  long lVar2;
  XkbDescPtr desc;
  char name [5];
  int key;
  int scancode;
  undefined4 local_d;
  undefined1 local_9;
  undefined4 local_8;
  uint local_4;
  
  memset(_glfw.x11.keycodes,0xff,0x200);
  memset(_glfw.x11.scancodes,0xff,0x2ba);
  if (_glfw.x11.xkb.available != 0) {
    lVar2 = XkbGetMap(_glfw.x11.display,0,0x100);
    XkbGetNames(_glfw.x11.display,0x200,lVar2);
    for (local_4 = (uint)*(byte *)(lVar2 + 0xc); (int)local_4 <= (int)(uint)*(byte *)(lVar2 + 0xd);
        local_4 = local_4 + 1) {
      local_d = *(undefined4 *)(*(long *)(*(long *)(lVar2 + 0x30) + 0x1c8) + (long)(int)local_4 * 4)
      ;
      local_9 = 0;
      iVar1 = strcmp((char *)&local_d,"TLDE");
      if (iVar1 == 0) {
        local_8 = 0x60;
      }
      else {
        iVar1 = strcmp((char *)&local_d,"AE01");
        if (iVar1 == 0) {
          local_8 = 0x31;
        }
        else {
          iVar1 = strcmp((char *)&local_d,"AE02");
          if (iVar1 == 0) {
            local_8 = 0x32;
          }
          else {
            iVar1 = strcmp((char *)&local_d,"AE03");
            if (iVar1 == 0) {
              local_8 = 0x33;
            }
            else {
              iVar1 = strcmp((char *)&local_d,"AE04");
              if (iVar1 == 0) {
                local_8 = 0x34;
              }
              else {
                iVar1 = strcmp((char *)&local_d,"AE05");
                if (iVar1 == 0) {
                  local_8 = 0x35;
                }
                else {
                  iVar1 = strcmp((char *)&local_d,"AE06");
                  if (iVar1 == 0) {
                    local_8 = 0x36;
                  }
                  else {
                    iVar1 = strcmp((char *)&local_d,"AE07");
                    if (iVar1 == 0) {
                      local_8 = 0x37;
                    }
                    else {
                      iVar1 = strcmp((char *)&local_d,"AE08");
                      if (iVar1 == 0) {
                        local_8 = 0x38;
                      }
                      else {
                        iVar1 = strcmp((char *)&local_d,"AE09");
                        if (iVar1 == 0) {
                          local_8 = 0x39;
                        }
                        else {
                          iVar1 = strcmp((char *)&local_d,"AE10");
                          if (iVar1 == 0) {
                            local_8 = 0x30;
                          }
                          else {
                            iVar1 = strcmp((char *)&local_d,"AE11");
                            if (iVar1 == 0) {
                              local_8 = 0x2d;
                            }
                            else {
                              iVar1 = strcmp((char *)&local_d,"AE12");
                              if (iVar1 == 0) {
                                local_8 = 0x3d;
                              }
                              else {
                                iVar1 = strcmp((char *)&local_d,"AD01");
                                if (iVar1 == 0) {
                                  local_8 = 0x51;
                                }
                                else {
                                  iVar1 = strcmp((char *)&local_d,"AD02");
                                  if (iVar1 == 0) {
                                    local_8 = 0x57;
                                  }
                                  else {
                                    iVar1 = strcmp((char *)&local_d,"AD03");
                                    if (iVar1 == 0) {
                                      local_8 = 0x45;
                                    }
                                    else {
                                      iVar1 = strcmp((char *)&local_d,"AD04");
                                      if (iVar1 == 0) {
                                        local_8 = 0x52;
                                      }
                                      else {
                                        iVar1 = strcmp((char *)&local_d,"AD05");
                                        if (iVar1 == 0) {
                                          local_8 = 0x54;
                                        }
                                        else {
                                          iVar1 = strcmp((char *)&local_d,"AD06");
                                          if (iVar1 == 0) {
                                            local_8 = 0x59;
                                          }
                                          else {
                                            iVar1 = strcmp((char *)&local_d,"AD07");
                                            if (iVar1 == 0) {
                                              local_8 = 0x55;
                                            }
                                            else {
                                              iVar1 = strcmp((char *)&local_d,"AD08");
                                              if (iVar1 == 0) {
                                                local_8 = 0x49;
                                              }
                                              else {
                                                iVar1 = strcmp((char *)&local_d,"AD09");
                                                if (iVar1 == 0) {
                                                  local_8 = 0x4f;
                                                }
                                                else {
                                                  iVar1 = strcmp((char *)&local_d,"AD10");
                                                  if (iVar1 == 0) {
                                                    local_8 = 0x50;
                                                  }
                                                  else {
                                                    iVar1 = strcmp((char *)&local_d,"AD11");
                                                    if (iVar1 == 0) {
                                                      local_8 = 0x5b;
                                                    }
                                                    else {
                                                      iVar1 = strcmp((char *)&local_d,"AD12");
                                                      if (iVar1 == 0) {
                                                        local_8 = 0x5d;
                                                      }
                                                      else {
                                                        iVar1 = strcmp((char *)&local_d,"AC01");
                                                        if (iVar1 == 0) {
                                                          local_8 = 0x41;
                                                        }
                                                        else {
                                                          iVar1 = strcmp((char *)&local_d,"AC02");
                                                          if (iVar1 == 0) {
                                                            local_8 = 0x53;
                                                          }
                                                          else {
                                                            iVar1 = strcmp((char *)&local_d,"AC03");
                                                            if (iVar1 == 0) {
                                                              local_8 = 0x44;
                                                            }
                                                            else {
                                                              iVar1 = strcmp((char *)&local_d,"AC04"
                                                                            );
                                                              if (iVar1 == 0) {
                                                                local_8 = 0x46;
                                                              }
                                                              else {
                                                                iVar1 = strcmp((char *)&local_d,
                                                                               "AC05");
                                                                if (iVar1 == 0) {
                                                                  local_8 = 0x47;
                                                                }
                                                                else {
                                                                  iVar1 = strcmp((char *)&local_d,
                                                                                 "AC06");
                                                                  if (iVar1 == 0) {
                                                                    local_8 = 0x48;
                                                                  }
                                                                  else {
                                                                    iVar1 = strcmp((char *)&local_d,
                                                                                   "AC07");
                                                                    if (iVar1 == 0) {
                                                                      local_8 = 0x4a;
                                                                    }
                                                                    else {
                                                                      iVar1 = strcmp((char *)&
                                                  local_d,"AC08");
                                                  if (iVar1 == 0) {
                                                    local_8 = 0x4b;
                                                  }
                                                  else {
                                                    iVar1 = strcmp((char *)&local_d,"AC09");
                                                    if (iVar1 == 0) {
                                                      local_8 = 0x4c;
                                                    }
                                                    else {
                                                      iVar1 = strcmp((char *)&local_d,"AC10");
                                                      if (iVar1 == 0) {
                                                        local_8 = 0x3b;
                                                      }
                                                      else {
                                                        iVar1 = strcmp((char *)&local_d,"AC11");
                                                        if (iVar1 == 0) {
                                                          local_8 = 0x27;
                                                        }
                                                        else {
                                                          iVar1 = strcmp((char *)&local_d,"AB01");
                                                          if (iVar1 == 0) {
                                                            local_8 = 0x5a;
                                                          }
                                                          else {
                                                            iVar1 = strcmp((char *)&local_d,"AB02");
                                                            if (iVar1 == 0) {
                                                              local_8 = 0x58;
                                                            }
                                                            else {
                                                              iVar1 = strcmp((char *)&local_d,"AB03"
                                                                            );
                                                              if (iVar1 == 0) {
                                                                local_8 = 0x43;
                                                              }
                                                              else {
                                                                iVar1 = strcmp((char *)&local_d,
                                                                               "AB04");
                                                                if (iVar1 == 0) {
                                                                  local_8 = 0x56;
                                                                }
                                                                else {
                                                                  iVar1 = strcmp((char *)&local_d,
                                                                                 "AB05");
                                                                  if (iVar1 == 0) {
                                                                    local_8 = 0x42;
                                                                  }
                                                                  else {
                                                                    iVar1 = strcmp((char *)&local_d,
                                                                                   "AB06");
                                                                    if (iVar1 == 0) {
                                                                      local_8 = 0x4e;
                                                                    }
                                                                    else {
                                                                      iVar1 = strcmp((char *)&
                                                  local_d,"AB07");
                                                  if (iVar1 == 0) {
                                                    local_8 = 0x4d;
                                                  }
                                                  else {
                                                    iVar1 = strcmp((char *)&local_d,"AB08");
                                                    if (iVar1 == 0) {
                                                      local_8 = 0x2c;
                                                    }
                                                    else {
                                                      iVar1 = strcmp((char *)&local_d,"AB09");
                                                      if (iVar1 == 0) {
                                                        local_8 = 0x2e;
                                                      }
                                                      else {
                                                        iVar1 = strcmp((char *)&local_d,"AB10");
                                                        if (iVar1 == 0) {
                                                          local_8 = 0x2f;
                                                        }
                                                        else {
                                                          iVar1 = strcmp((char *)&local_d,"BKSL");
                                                          if (iVar1 == 0) {
                                                            local_8 = 0x5c;
                                                          }
                                                          else {
                                                            iVar1 = strcmp((char *)&local_d,"LSGT");
                                                            if (iVar1 == 0) {
                                                              local_8 = 0xa1;
                                                            }
                                                            else {
                                                              local_8 = 0xffffffff;
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if ((-1 < (int)local_4) && ((int)local_4 < 0x100)) {
        _glfw.x11.keycodes[(int)local_4] = (short)local_8;
      }
    }
    XkbFreeNames(lVar2,0x200,1);
    XkbFreeKeyboard(lVar2,0,1);
  }
  for (local_4 = 0; (int)local_4 < 0x100; local_4 = local_4 + 1) {
    if (_glfw.x11.keycodes[(int)local_4] < 0) {
      iVar1 = translateKeyCode((int)desc);
      _glfw.x11.keycodes[(int)local_4] = (short)iVar1;
    }
    if (0 < _glfw.x11.keycodes[(int)local_4]) {
      _glfw.x11.scancodes[_glfw.x11.keycodes[(int)local_4]] = (short)local_4;
    }
  }
  return;
}

Assistant:

static void createKeyTables(void)
{
    int scancode, key;

    memset(_glfw.x11.keycodes, -1, sizeof(_glfw.x11.keycodes));
    memset(_glfw.x11.scancodes, -1, sizeof(_glfw.x11.scancodes));

    if (_glfw.x11.xkb.available)
    {
        // Use XKB to determine physical key locations independently of the
        // current keyboard layout

        char name[XkbKeyNameLength + 1];
        XkbDescPtr desc = XkbGetMap(_glfw.x11.display, 0, XkbUseCoreKbd);
        XkbGetNames(_glfw.x11.display, XkbKeyNamesMask, desc);

        // Find the X11 key code -> GLFW key code mapping
        for (scancode = desc->min_key_code;  scancode <= desc->max_key_code;  scancode++)
        {
            memcpy(name, desc->names->keys[scancode].name, XkbKeyNameLength);
            name[XkbKeyNameLength] = '\0';

            // Map the key name to a GLFW key code. Note: We only map printable
            // keys here, and we use the US keyboard layout. The rest of the
            // keys (function keys) are mapped using traditional KeySym
            // translations.
            if (strcmp(name, "TLDE") == 0) key = GLFW_KEY_GRAVE_ACCENT;
            else if (strcmp(name, "AE01") == 0) key = GLFW_KEY_1;
            else if (strcmp(name, "AE02") == 0) key = GLFW_KEY_2;
            else if (strcmp(name, "AE03") == 0) key = GLFW_KEY_3;
            else if (strcmp(name, "AE04") == 0) key = GLFW_KEY_4;
            else if (strcmp(name, "AE05") == 0) key = GLFW_KEY_5;
            else if (strcmp(name, "AE06") == 0) key = GLFW_KEY_6;
            else if (strcmp(name, "AE07") == 0) key = GLFW_KEY_7;
            else if (strcmp(name, "AE08") == 0) key = GLFW_KEY_8;
            else if (strcmp(name, "AE09") == 0) key = GLFW_KEY_9;
            else if (strcmp(name, "AE10") == 0) key = GLFW_KEY_0;
            else if (strcmp(name, "AE11") == 0) key = GLFW_KEY_MINUS;
            else if (strcmp(name, "AE12") == 0) key = GLFW_KEY_EQUAL;
            else if (strcmp(name, "AD01") == 0) key = GLFW_KEY_Q;
            else if (strcmp(name, "AD02") == 0) key = GLFW_KEY_W;
            else if (strcmp(name, "AD03") == 0) key = GLFW_KEY_E;
            else if (strcmp(name, "AD04") == 0) key = GLFW_KEY_R;
            else if (strcmp(name, "AD05") == 0) key = GLFW_KEY_T;
            else if (strcmp(name, "AD06") == 0) key = GLFW_KEY_Y;
            else if (strcmp(name, "AD07") == 0) key = GLFW_KEY_U;
            else if (strcmp(name, "AD08") == 0) key = GLFW_KEY_I;
            else if (strcmp(name, "AD09") == 0) key = GLFW_KEY_O;
            else if (strcmp(name, "AD10") == 0) key = GLFW_KEY_P;
            else if (strcmp(name, "AD11") == 0) key = GLFW_KEY_LEFT_BRACKET;
            else if (strcmp(name, "AD12") == 0) key = GLFW_KEY_RIGHT_BRACKET;
            else if (strcmp(name, "AC01") == 0) key = GLFW_KEY_A;
            else if (strcmp(name, "AC02") == 0) key = GLFW_KEY_S;
            else if (strcmp(name, "AC03") == 0) key = GLFW_KEY_D;
            else if (strcmp(name, "AC04") == 0) key = GLFW_KEY_F;
            else if (strcmp(name, "AC05") == 0) key = GLFW_KEY_G;
            else if (strcmp(name, "AC06") == 0) key = GLFW_KEY_H;
            else if (strcmp(name, "AC07") == 0) key = GLFW_KEY_J;
            else if (strcmp(name, "AC08") == 0) key = GLFW_KEY_K;
            else if (strcmp(name, "AC09") == 0) key = GLFW_KEY_L;
            else if (strcmp(name, "AC10") == 0) key = GLFW_KEY_SEMICOLON;
            else if (strcmp(name, "AC11") == 0) key = GLFW_KEY_APOSTROPHE;
            else if (strcmp(name, "AB01") == 0) key = GLFW_KEY_Z;
            else if (strcmp(name, "AB02") == 0) key = GLFW_KEY_X;
            else if (strcmp(name, "AB03") == 0) key = GLFW_KEY_C;
            else if (strcmp(name, "AB04") == 0) key = GLFW_KEY_V;
            else if (strcmp(name, "AB05") == 0) key = GLFW_KEY_B;
            else if (strcmp(name, "AB06") == 0) key = GLFW_KEY_N;
            else if (strcmp(name, "AB07") == 0) key = GLFW_KEY_M;
            else if (strcmp(name, "AB08") == 0) key = GLFW_KEY_COMMA;
            else if (strcmp(name, "AB09") == 0) key = GLFW_KEY_PERIOD;
            else if (strcmp(name, "AB10") == 0) key = GLFW_KEY_SLASH;
            else if (strcmp(name, "BKSL") == 0) key = GLFW_KEY_BACKSLASH;
            else if (strcmp(name, "LSGT") == 0) key = GLFW_KEY_WORLD_1;
            else key = GLFW_KEY_UNKNOWN;

            if ((scancode >= 0) && (scancode < 256))
                _glfw.x11.keycodes[scancode] = key;
        }

        XkbFreeNames(desc, XkbKeyNamesMask, True);
        XkbFreeKeyboard(desc, 0, True);
    }

    for (scancode = 0;  scancode < 256;  scancode++)
    {
        // Translate the un-translated key codes using traditional X11 KeySym
        // lookups
        if (_glfw.x11.keycodes[scancode] < 0)
            _glfw.x11.keycodes[scancode] = translateKeyCode(scancode);

        // Store the reverse translation for faster key name lookup
        if (_glfw.x11.keycodes[scancode] > 0)
            _glfw.x11.scancodes[_glfw.x11.keycodes[scancode]] = scancode;
    }
}